

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestServiceWithCustomOptions::CallMethod
          (TestServiceWithCustomOptions *this,MethodDescriptor *method,RpcController *controller,
          Message *request,Message *response,Closure *done)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  CustomOptionFooRequest *pCVar1;
  CustomOptionFooResponse *pCVar2;
  Nonnull<const_char_*> pcVar3;
  LogMessage local_40;
  
  if (method->service_ ==
      file_level_service_descriptors_google_2fprotobuf_2funittest_5fcustom_5foptions_2eproto[0]) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (method->service_,
                        file_level_service_descriptors_google_2fprotobuf_2funittest_5fcustom_5foptions_2eproto
                        [0],
                        "method->service() == file_level_service_descriptors_google_2fprotobuf_2funittest_5fcustom_5foptions_2eproto[0]"
                       );
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((int)((ulong)((long)method - (long)method->service_->methods_) >> 4) * -0x33333333 == 0) {
      pCVar1 = google::protobuf::DownCastMessage<proto2_unittest::CustomOptionFooRequest>
                         (&request->super_MessageLite);
      pCVar2 = google::protobuf::DownCastMessage<proto2_unittest::CustomOptionFooResponse>
                         (&response->super_MessageLite);
      UNRECOVERED_JUMPTABLE = (this->super_Service)._vptr_Service[6];
      (*UNRECOVERED_JUMPTABLE)(this,controller,pCVar1,pCVar2,done,UNRECOVERED_JUMPTABLE);
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_custom_options.pb.cc"
               ,0x1c9f);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_40,(char (*) [44])"Bad method index; this should never happen.");
  }
  else {
    CallMethod();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void TestServiceWithCustomOptions::CallMethod(
    const ::google::protobuf::MethodDescriptor* PROTOBUF_NONNULL method,
    ::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
    const ::google::protobuf::Message* PROTOBUF_NONNULL request,
    ::google::protobuf::Message* PROTOBUF_NONNULL response, ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  ABSL_DCHECK_EQ(method->service(), file_level_service_descriptors_google_2fprotobuf_2funittest_5fcustom_5foptions_2eproto[0]);
  switch (method->index()) {
    case 0:
      this->Foo(controller, ::google::protobuf::DownCastMessage<::proto2_unittest::CustomOptionFooRequest>(request),
                   ::google::protobuf::DownCastMessage<::proto2_unittest::CustomOptionFooResponse>(response), done);
      break;

    default:
      ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
      break;
  }
}